

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O2

int __thiscall t_html_generator::print_type(t_html_generator *this,t_type *ttype)

{
  ofstream_with_content_based_conditional_update *poVar1;
  _func_int **pp_Var2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar6;
  string prog_name;
  string type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  allocator local_90 [8];
  int local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  poVar1 = &this->f_out_;
  std::operator<<((ostream *)poVar1,"<code>");
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
  pp_Var2 = (ttype->super_t_doc)._vptr_t_doc;
  if ((char)iVar3 != '\0') {
    iVar3 = (*pp_Var2[0xe])();
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
        if ((char)iVar3 == '\0') {
          iVar3 = 0;
          goto LAB_001ed0e7;
        }
        std::operator<<((ostream *)poVar1,"map&lt;");
        iVar4 = print_type(this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
        std::operator<<((ostream *)poVar1,", ");
        iVar3 = print_type(this,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
        iVar3 = iVar3 + iVar4 + 5;
      }
      else {
        std::operator<<((ostream *)poVar1,"set&lt;");
        iVar3 = print_type(this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
        iVar3 = iVar3 + 5;
      }
    }
    else {
      std::operator<<((ostream *)poVar1,"list&lt;");
      iVar3 = print_type(this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      iVar3 = iVar3 + 6;
    }
    std::operator<<((ostream *)poVar1,"&gt;");
    goto LAB_001ed0e7;
  }
  iVar3 = (*pp_Var2[5])(ttype);
  if ((char)iVar3 != '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
      std::__cxx11::string::string((string *)&local_b0,(string *)CONCAT44(extraout_var_00,iVar3));
    }
    else {
      std::__cxx11::string::string((string *)&local_b0,"binary",local_90);
    }
    std::operator<<((ostream *)poVar1,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    iVar3 = (int)*(undefined8 *)(CONCAT44(extraout_var_01,iVar3) + 8);
    goto LAB_001ed0e7;
  }
  std::__cxx11::string::string((string *)&local_b0,(string *)&ttype->program_->name_);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
  std::__cxx11::string::string((string *)local_90,(string *)CONCAT44(extraout_var,iVar3));
  poVar5 = std::operator<<((ostream *)poVar1,"<a href=\"");
  std::operator+(&local_70,&local_b0,".html");
  make_file_link(&local_50,this,&local_70);
  poVar5 = std::operator<<(poVar5,(string *)&local_50);
  std::operator<<(poVar5,"#");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[9])(ttype);
  pcVar6 = "Struct_";
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
    if ((char)iVar3 != '\0') goto LAB_001ed05a;
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype);
    if ((char)iVar3 != '\0') goto LAB_001ed05a;
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
    if ((char)iVar3 != '\0') {
      pcVar6 = "Enum_";
      goto LAB_001ed05a;
    }
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x11])(ttype);
    if ((char)iVar3 != '\0') {
      pcVar6 = "Svc_";
      goto LAB_001ed05a;
    }
  }
  else {
LAB_001ed05a:
    std::operator<<((ostream *)poVar1,pcVar6);
  }
  poVar5 = std::operator<<((ostream *)poVar1,(string *)local_90);
  std::operator<<(poVar5,"\">");
  iVar3 = local_88;
  if (ttype->program_ != (this->super_t_generator).program_) {
    poVar5 = std::operator<<((ostream *)poVar1,(string *)&local_b0);
    std::operator<<(poVar5,".");
    iVar3 = local_88 + (int)local_b0._M_string_length + 1;
  }
  poVar5 = std::operator<<((ostream *)poVar1,(string *)local_90);
  std::operator<<(poVar5,"</a>");
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)&local_b0);
LAB_001ed0e7:
  std::operator<<((ostream *)poVar1,"</code>");
  return iVar3;
}

Assistant:

int t_html_generator::print_type(t_type* ttype) {
  std::string::size_type len = 0;
  f_out_ << "<code>";
  if (ttype->is_container()) {
    if (ttype->is_list()) {
      f_out_ << "list&lt;";
      len = 6 + print_type(((t_list*)ttype)->get_elem_type());
      f_out_ << "&gt;";
    } else if (ttype->is_set()) {
      f_out_ << "set&lt;";
      len = 5 + print_type(((t_set*)ttype)->get_elem_type());
      f_out_ << "&gt;";
    } else if (ttype->is_map()) {
      f_out_ << "map&lt;";
      len = 5 + print_type(((t_map*)ttype)->get_key_type());
      f_out_ << ", ";
      len += print_type(((t_map*)ttype)->get_val_type());
      f_out_ << "&gt;";
    }
  } else if (ttype->is_base_type()) {
    f_out_ << (ttype->is_binary() ? "binary" : ttype->get_name());
    len = ttype->get_name().size();
  } else {
    string prog_name = ttype->get_program()->get_name();
    string type_name = ttype->get_name();
    f_out_ << "<a href=\"" << make_file_link(prog_name + ".html") << "#";
    if (ttype->is_typedef()) {
      f_out_ << "Struct_";
    } else if (ttype->is_struct() || ttype->is_xception()) {
      f_out_ << "Struct_";
    } else if (ttype->is_enum()) {
      f_out_ << "Enum_";
    } else if (ttype->is_service()) {
      f_out_ << "Svc_";
    }
    f_out_ << type_name << "\">";
    len = type_name.size();
    if (ttype->get_program() != program_) {
      f_out_ << prog_name << ".";
      len += prog_name.size() + 1;
    }
    f_out_ << type_name << "</a>";
  }
  f_out_ << "</code>";
  return (int)len;
}